

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void line_attempt_3(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  int y;
  float t;
  int x;
  bool steep;
  TGAImage *image_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  TGAColor color_local;
  
  register0x00000000 = color.bgra;
  x0_local._3_1_ = color.bytespp;
  iVar1 = x0 - x1;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar3 = y0 - y1;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  image_local._0_4_ = y1;
  image_local._4_4_ = x1;
  y1_local = y0;
  x1_local = x0;
  if (iVar1 < iVar3) {
    std::swap<int>(&x1_local,&y1_local);
    std::swap<int>((int *)((long)&image_local + 4),(int *)&image_local);
  }
  if (image_local._4_4_ < x1_local) {
    std::swap<int>(&x1_local,(int *)((long)&image_local + 4));
    std::swap<int>(&y1_local,(int *)&image_local);
  }
  for (y = x1_local; y <= image_local._4_4_; y = y + 1) {
    fVar4 = (float)(y - x1_local) / (float)(image_local._4_4_ - x1_local);
    iVar2 = (int)((float)y1_local * (1.0 - fVar4) + (float)(int)image_local * fVar4);
    if (iVar1 < iVar3) {
      TGAImage::set(image,(long)iVar2,(long)y,(TGAColor *)((long)&y0_local + 3));
    }
    else {
      TGAImage::set(image,(long)y,(long)iVar2,(TGAColor *)((long)&y0_local + 3));
    }
  }
  return;
}

Assistant:

void line_attempt_3(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    bool steep = false;
    if (std::abs(x0 - x1) < std::abs(y0 - y1)) {  // if the line is steep, we transpose the image
        std::swap(x0, y0);
        std::swap(x1, y1);
        steep = true;
    }
    if (x0 > x1) {  // make it left−to−right
        std::swap(x0, x1);
        std::swap(y0, y1);
    }
    for (int x = x0; x <= x1; x++) {
        float t = static_cast<float>(x - x0) / static_cast<float>(x1 - x0);
        int y = static_cast<int>(y0 * (1. - t) + static_cast<float>(y1) * t);
        if (steep) {
            image.set(y, x, color);  // if transposed, de−transpose
        } else {
            image.set(x, y, color);
        }
    }
}